

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll.cpp
# Opt level: O2

int __thiscall ncnn::BNLL::forward_inplace(BNLL *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int c;
  float fVar6;
  float fVar7;
  Mat local_68;
  
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  uVar2 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar2;
  }
  iVar3 = bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    iVar3 = 0;
  }
  while (c = (int)uVar2, c != iVar3) {
    Mat::channel(&local_68,bottom_top_blob,c);
    pvVar1 = local_68.data;
    Mat::~Mat(&local_68);
    for (uVar2 = 0; uVar5 != uVar2; uVar2 = uVar2 + 1) {
      fVar7 = *(float *)((long)pvVar1 + uVar2 * 4);
      if (fVar7 <= 0.0) {
        fVar7 = expf(fVar7);
        fVar6 = logf(fVar7 + 1.0);
      }
      else {
        fVar6 = expf(-fVar7);
        fVar6 = logf(fVar6 + 1.0);
        fVar6 = fVar6 + fVar7;
      }
      *(float *)((long)pvVar1 + uVar2 * 4) = fVar6;
    }
    uVar2 = (ulong)(c + 1);
  }
  return 0;
}

Assistant:

int BNLL::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            if (ptr[i] > 0)
                ptr[i] = ptr[i] + log(1.f + exp(-ptr[i]));
            else
                ptr[i] = log(1.f + exp(ptr[i]));
        }
    }

    return 0;
}